

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O3

void __thiscall agge::tests::DashTests::ThePatternIsAppliedPeriodically(DashTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  FailedAssertion *pFVar4;
  long lVar5;
  undefined8 *puVar6;
  point *ppVar7;
  byte bVar8;
  point reference2 [5];
  dash d;
  point reference1 [7];
  undefined1 local_238 [8];
  undefined4 uStack_230;
  undefined4 uStack_22c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined8 uStack_218;
  undefined4 uStack_210;
  undefined4 local_20c;
  undefined4 uStack_208;
  undefined8 uStack_204;
  dash local_1f0;
  undefined1 local_198 [44];
  int local_16c;
  pointer local_168;
  int local_160;
  LocationInfo local_150;
  point local_128 [6];
  undefined4 local_d8;
  point local_c8;
  real_t local_bc;
  real_t rStack_b8;
  int local_b4;
  point local_b0;
  point local_a4;
  point local_98;
  point local_8c;
  point local_80;
  string local_70;
  string local_50;
  
  bVar8 = 0;
  dash::dash(&local_1f0);
  dash::add_dash(&local_1f0,5.0,10.0);
  dash::add_vertex(&local_1f0,0.0,0.0,1);
  dash::add_vertex(&local_1f0,44.99,0.0,2);
  local_128[0].command = 0;
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  local_c8.command = dash::vertex(&local_1f0,&local_128[0].x,&local_128[0].y);
  local_c8.x = local_128[0].x;
  local_c8.y = local_128[0].y;
  local_128[0].command = 0;
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  local_b4 = dash::vertex(&local_1f0,&local_128[0].x,&local_128[0].y);
  local_bc = local_128[0].x;
  rStack_b8 = local_128[0].y;
  local_128[0].command = 0;
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  local_b0.command = dash::vertex(&local_1f0,&local_128[0].x,&local_128[0].y);
  local_b0.x = local_128[0].x;
  local_b0.y = local_128[0].y;
  local_128[0].command = 0;
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  local_a4.command = dash::vertex(&local_1f0,&local_128[0].x,&local_128[0].y);
  local_a4.x = local_128[0].x;
  local_a4.y = local_128[0].y;
  local_128[0].command = 0;
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  local_98.command = dash::vertex(&local_1f0,&local_128[0].x,&local_128[0].y);
  local_98.x = local_128[0].x;
  local_98.y = local_128[0].y;
  local_128[0].command = 0;
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  local_8c.command = dash::vertex(&local_1f0,&local_128[0].x,&local_128[0].y);
  local_8c.x = local_128[0].x;
  local_8c.y = local_128[0].y;
  local_128[0].command = 0;
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  local_80.command = dash::vertex(&local_1f0,&local_128[0].x,&local_128[0].y);
  local_80.x = local_128[0].x;
  local_80.y = local_128[0].y;
  puVar6 = &DAT_0019ea30;
  ppVar7 = local_128;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar2 = *puVar6;
    ppVar7->x = (real_t)(int)uVar2;
    ppVar7->y = (real_t)(int)((ulong)uVar2 >> 0x20);
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    ppVar7 = (point *)((long)ppVar7 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  local_d8 = 0;
  paVar1 = &local_150.filename.field_2;
  local_150.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_198,&local_150.filename,0x8c);
  lVar5 = 0;
  do {
    bVar3 = mocks::path::point::operator==
                      ((point *)((long)&local_128[0].x + lVar5),(point *)((long)&local_c8.x + lVar5)
                      );
    if (!bVar3) {
      pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_238 = (undefined1  [8])&local_228;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_238,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar4,(string *)local_238,(LocationInfo *)local_198);
      __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x54);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_150.filename._M_dataplus._M_p);
  }
  dash::remove_all_dashes(&local_1f0);
  dash::add_dash(&local_1f0,5.0,7.0);
  dash::remove_all(&local_1f0);
  dash::add_vertex(&local_1f0,0.0,0.0,1);
  dash::add_vertex(&local_1f0,24.0,0.0,2);
  uStack_230 = 0;
  local_238 = (undefined1  [8])0x0;
  local_198._8_4_ = dash::vertex(&local_1f0,(real_t *)local_238,(real_t *)(local_238 + 4));
  local_198._0_8_ = local_238;
  uStack_230 = 0;
  local_238 = (undefined1  [8])0x0;
  local_198._20_4_ = dash::vertex(&local_1f0,(real_t *)local_238,(real_t *)(local_238 + 4));
  local_198._12_8_ = local_238;
  uStack_230 = 0;
  local_238 = (undefined1  [8])0x0;
  local_198._32_4_ = dash::vertex(&local_1f0,(real_t *)local_238,(real_t *)(local_238 + 4));
  local_198._24_8_ = local_238;
  uStack_230 = 0;
  local_238 = (undefined1  [8])0x0;
  local_16c = dash::vertex(&local_1f0,(real_t *)local_238,(real_t *)(local_238 + 4));
  local_198._36_8_ = local_238;
  uStack_230 = 0;
  local_238 = (undefined1  [8])0x0;
  local_160 = dash::vertex(&local_1f0,(real_t *)local_238,(real_t *)(local_238 + 4));
  local_168 = (pointer)local_238;
  uStack_208 = 0;
  uStack_204 = 0;
  uStack_218 = 0x4188000000000001;
  uStack_210 = 0;
  local_20c = 2;
  local_228._M_allocated_capacity = 0x200000000;
  local_228._8_8_ = 0x41400000;
  local_238 = (undefined1  [8])0x0;
  uStack_230 = 1;
  uStack_22c = 0x40a00000;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_150,&local_70,0xa5);
  lVar5 = 0;
  do {
    bVar3 = mocks::path::point::operator==
                      ((point *)(local_238 + lVar5),(point *)(local_198 + lVar5));
    if (!bVar3) {
      pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar4,&local_50,&local_150);
      __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x3c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_150.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_1f0._pattern._begin != (dash_gap *)0x0) {
    operator_delete__(local_1f0._pattern._begin);
  }
  if (local_1f0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin != (vertex *)0x0) {
    operator_delete__(local_1f0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin);
  }
  return;
}

Assistant:

test( ThePatternIsAppliedPeriodically )
			{
				// INIT
				dash d;

				d.add_dash(5.0f, 10.0f);

				// ACT
				move_to(d, 0.0f, 0.0f);
				line_to(d, 44.99f, 0.0f);
				mocks::path::point result1[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					{ 0.0f, 0.0f, path_command_move_to },
					{ 5.0f, 0.0f, path_command_line_to },
					{ 15.0f, 0.0f, path_command_move_to },
					{ 20.0f, 0.0f, path_command_line_to },
					{ 30.0f, 0.0f, path_command_move_to },
					{ 35.0f, 0.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// INIT
				d.remove_all_dashes();
				d.add_dash(5.0f, 7.0f);
				d.remove_all();

				// ACT (pattern end coincides with segment end)
				move_to(d, 0.0f, 0.0f);
				line_to(d, 24.0f, 0.0f);
				mocks::path::point result2[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference2[] = {
					{ 0.0f, 0.0f, path_command_move_to },
					{ 5.0f, 0.0f, path_command_line_to },
					{ 12.0f, 0.0f, path_command_move_to },
					{ 17.0f, 0.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}